

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickle_row.c
# Opt level: O2

void PickleRows_delete(PickleRows *pickle_rows)

{
  long lVar1;
  wchar_t i;
  long lVar2;
  
  if (pickle_rows != (PickleRows *)0x0) {
    if (pickle_rows->pickle_rows != (PickleRow *)0x0) {
      lVar1 = 0;
      for (lVar2 = 0; lVar2 < pickle_rows->row_count; lVar2 = lVar2 + 1) {
        delete_pickle_row_content
                  ((PickleRow *)((long)&pickle_rows->pickle_rows->pickle_cells + lVar1));
        lVar1 = lVar1 + 8;
      }
      free(pickle_rows->pickle_rows);
    }
    free(pickle_rows);
    return;
  }
  return;
}

Assistant:

void PickleRows_delete(const PickleRows* pickle_rows) {
    if (!pickle_rows) {
        return;
    }
    if (pickle_rows->pickle_rows) {
        int i;
        for(i = 0; i < pickle_rows->row_count; ++i) {
            delete_pickle_row_content(pickle_rows->pickle_rows + i);
        }
        free((void*)pickle_rows->pickle_rows);
    }
    free((void*)pickle_rows);
}